

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

xmlXPathObjectPtr xmlXPathEval(xmlChar *str,xmlXPathContextPtr ctx)

{
  xmlXPathParserContextPtr ctxt;
  xmlXPathObjectPtr pxVar1;
  
  if (ctx == (xmlXPathContextPtr)0x0) {
    return (xmlXPathObjectPtr)0x0;
  }
  xmlInitParser();
  xmlResetError(&ctx->lastError);
  ctxt = xmlXPathNewParserContext(str,ctx);
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return (xmlXPathObjectPtr)0x0;
  }
  xmlXPathEvalExpr(ctxt);
  if (ctxt->error == 0) {
    if (ctxt->valueNr == 1) {
      ctxt->valueNr = 0;
      ctxt->value = (xmlXPathObjectPtr)0x0;
      pxVar1 = *ctxt->valueTab;
      *ctxt->valueTab = (xmlXPathObjectPtr)0x0;
      goto LAB_001c173f;
    }
    xmlXPathErr(ctxt,0x17);
  }
  pxVar1 = (xmlXPathObjectPtr)0x0;
LAB_001c173f:
  xmlXPathFreeParserContext(ctxt);
  return pxVar1;
}

Assistant:

xmlXPathObjectPtr
xmlXPathEval(const xmlChar *str, xmlXPathContextPtr ctx) {
    xmlXPathParserContextPtr ctxt;
    xmlXPathObjectPtr res;

    if (ctx == NULL)
        return(NULL);

    xmlInitParser();

    xmlResetError(&ctx->lastError);

    ctxt = xmlXPathNewParserContext(str, ctx);
    if (ctxt == NULL)
        return NULL;
    xmlXPathEvalExpr(ctxt);

    if (ctxt->error != XPATH_EXPRESSION_OK) {
	res = NULL;
    } else if (ctxt->valueNr != 1) {
        xmlXPathErr(ctxt, XPATH_STACK_ERROR);
	res = NULL;
    } else {
	res = xmlXPathValuePop(ctxt);
    }

    xmlXPathFreeParserContext(ctxt);
    return(res);
}